

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::LivenessManager::AnalyzeAccessChainLoc
          (LivenessManager *this,Instruction *ac,uint32_t curr_type_id,uint32_t *offset,bool *no_loc
          ,bool is_patch,bool input)

{
  ExecutionModel EVar1;
  DefUseManager *pDVar2;
  DecorationManager *pDVar3;
  bool bVar4;
  uint32_t curr_type_id_local;
  uint32_t *local_70;
  bool *local_68;
  Instruction *local_60;
  uint32_t ocnt;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  curr_type_id_local = curr_type_id;
  local_70 = offset;
  local_68 = no_loc;
  local_60 = ac;
  pDVar2 = IRContext::get_def_use_mgr(this->ctx_);
  pDVar3 = IRContext::get_decoration_mgr(this->ctx_);
  EVar1 = IRContext::GetStage(this->ctx_);
  bVar4 = EVar1 - TessellationControl < 3;
  if (!input) {
    bVar4 = EVar1 == TessellationControl;
  }
  ocnt = 0;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x40);
  *(LivenessManager **)local_50._M_unused._0_8_ = this;
  *(uint32_t **)((long)local_50._M_unused._0_8_ + 8) = &ocnt;
  *(DefUseManager **)((long)local_50._M_unused._0_8_ + 0x10) = pDVar2;
  *(DecorationManager **)((long)local_50._M_unused._0_8_ + 0x18) = pDVar3;
  *(uint32_t **)((long)local_50._M_unused._0_8_ + 0x20) = &curr_type_id_local;
  *(uint32_t **)((long)local_50._M_unused._0_8_ + 0x28) = local_70;
  *(bool **)((long)local_50._M_unused._0_8_ + 0x30) = local_68;
  *(char *)((long)local_50._M_unused._0_8_ + 0x38) = !is_patch & bVar4;
  local_38 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/liveness.cpp:188:26)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/liveness.cpp:188:26)>
             ::_M_manager;
  Instruction::WhileEachInOperand(local_60,(function<bool_(const_unsigned_int_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return curr_type_id_local;
}

Assistant:

uint32_t LivenessManager::AnalyzeAccessChainLoc(const Instruction* ac,
                                                uint32_t curr_type_id,
                                                uint32_t* offset, bool* no_loc,
                                                bool is_patch, bool input) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::DecorationManager* deco_mgr = context()->get_decoration_mgr();
  // For tesc, tese and geom input variables, and tesc output variables,
  // first array index does not contribute to offset.
  auto stage = context()->GetStage();
  bool skip_first_index = false;
  if ((input && (stage == spv::ExecutionModel::TessellationControl ||
                 stage == spv::ExecutionModel::TessellationEvaluation ||
                 stage == spv::ExecutionModel::Geometry)) ||
      (!input && stage == spv::ExecutionModel::TessellationControl))
    skip_first_index = !is_patch;
  uint32_t ocnt = 0;
  ac->WhileEachInOperand([this, &ocnt, def_use_mgr, deco_mgr, &curr_type_id,
                          offset, no_loc,
                          skip_first_index](const uint32_t* opnd) {
    if (ocnt >= 1) {
      // Skip first index's contribution to offset if indicated
      Instruction* curr_type_inst = def_use_mgr->GetDef(curr_type_id);
      if (ocnt == 1 && skip_first_index) {
        assert(curr_type_inst->opcode() == spv::Op::OpTypeArray &&
               "unexpected wrapper type");
        const uint32_t kArrayElementTypeInIdx = 0;
        curr_type_id =
            curr_type_inst->GetSingleWordInOperand(kArrayElementTypeInIdx);
        ocnt++;
        return true;
      }
      // If any non-constant index, mark the entire current object and return.
      auto idx_inst = def_use_mgr->GetDef(*opnd);
      if (idx_inst->opcode() != spv::Op::OpConstant) return false;
      // If current type is struct, look for location decoration on member and
      // reset offset if found.
      auto index = idx_inst->GetSingleWordInOperand(0);
      if (curr_type_inst->opcode() == spv::Op::OpTypeStruct) {
        uint32_t loc = 0;
        bool no_mem_loc = deco_mgr->WhileEachDecoration(
            curr_type_id, uint32_t(spv::Decoration::Location),
            [&loc, index, no_loc](const Instruction& deco) {
              assert(deco.opcode() == spv::Op::OpMemberDecorate &&
                     "unexpected decoration");
              if (deco.GetSingleWordInOperand(kOpDecorateMemberMemberInIdx) ==
                  index) {
                loc =
                    deco.GetSingleWordInOperand(kOpDecorateMemberLocationInIdx);
                *no_loc = false;
                return false;
              }
              return true;
            });
        if (!no_mem_loc) {
          *offset = loc;
          curr_type_id = curr_type_inst->GetSingleWordInOperand(index);
          ocnt++;
          return true;
        }
      }

      // Update offset and current type based on constant index.
      *offset += GetLocOffset(index, curr_type_id);
      curr_type_id = GetComponentType(index, curr_type_id);
    }
    ocnt++;
    return true;
  });
  return curr_type_id;
}